

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O1

void __thiscall Potassco::TheoryData::DestroyT::operator()(DestroyT *this,TheoryTerm *t)

{
  ulong uVar1;
  uint uVar2;
  void *pvVar3;
  
  uVar1 = t->data_;
  if (uVar1 != 0xffffffffffffffff) {
    uVar2 = (uint)uVar1 & 3;
    if (uVar2 == 1) {
      TheoryTerm::assertType(t,(Theory_t)0x1);
      pvVar3 = (void *)(t->data_ & 0xfffffffffffffffc);
      if (pvVar3 != (void *)0x0) {
        operator_delete__(pvVar3);
        return;
      }
    }
    else if ((uVar2 == 2) && ((void *)(uVar1 & 0xfffffffffffffffc) != (void *)0x0)) {
      operator_delete((void *)(uVar1 & 0xfffffffffffffffc));
      return;
    }
  }
  return;
}

Assistant:

Theory_t TheoryTerm::type() const { POTASSCO_REQUIRE(valid(), "Invalid term"); return static_cast<Theory_t>(data_&typeMask); }